

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

lws_role_ops * lws_role_by_name(char *name)

{
  lws_role_ops *plVar1;
  int iVar2;
  lws_role_ops **ppxx;
  lws_role_ops **pplVar3;
  
  pplVar3 = available_roles;
  while (plVar1 = *pplVar3, plVar1 != (lws_role_ops *)0x0) {
    pplVar3 = pplVar3 + 1;
    iVar2 = strcmp(plVar1->name,name);
    if (iVar2 == 0) {
      return plVar1;
    }
  }
  iVar2 = strcmp(name,"raw-skt");
  if (iVar2 == 0) {
    return &role_ops_raw_skt;
  }
  iVar2 = strcmp(name,"raw-file");
  if (iVar2 != 0) {
    return (lws_role_ops *)0x0;
  }
  return &role_ops_raw_file;
}

Assistant:

const struct lws_role_ops *
lws_role_by_name(const char *name)
{
	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (!strcmp(ar->name, name))
			return ar;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	if (!strcmp(name, role_ops_raw_skt.name))
		return &role_ops_raw_skt;

	if (!strcmp(name, role_ops_raw_file.name))
		return &role_ops_raw_file;

	return NULL;
}